

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_mark_relax(REF_SUBDIV ref_subdiv)

{
  int iVar1;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  uint uVar3;
  REF_INT RVar4;
  REF_INT RVar5;
  REF_INT RVar6;
  REF_INT RVar7;
  uint uVar8;
  REF_INT *pRVar9;
  REF_GRID pRVar10;
  REF_CELL *ppRVar11;
  undefined8 uVar12;
  long lVar13;
  ulong uVar14;
  char *pcVar15;
  REF_INT cell;
  REF_BOOL again;
  REF_INT nmark;
  REF_BOOL local_4c;
  uint local_48;
  REF_INT local_44;
  REF_INT local_40;
  uint local_3c;
  long local_38;
  
  uVar3 = ref_edge_ghost_int(ref_subdiv->edge,ref_subdiv->grid->mpi,ref_subdiv->mark);
  if (uVar3 == 0) {
    local_48 = 0;
    do {
      local_48 = local_48 + 1;
      local_4c = 0;
      pRVar10 = ref_subdiv->grid;
      ppRVar11 = pRVar10->cell + 8;
      lVar13 = 8;
      do {
        ref_cell = *ppRVar11;
        if (0 < ref_cell->max) {
          cell = 0;
          local_38 = lVar13;
          do {
            if (ref_cell->c2n[(long)cell * (long)ref_cell->size_per] != -1) {
              iVar1 = ref_cell->node_per;
              if (iVar1 == 6) {
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,6,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar4] != pRVar2[RVar5]) {
                  local_4c = 1;
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,8,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar4] != pRVar2[RVar5]) {
                  local_4c = 1;
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,7,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar4] != pRVar2[RVar5]) {
                  local_4c = 1;
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
                RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar5] + pRVar2[RVar4] + pRVar2[RVar6] == 2) {
                  local_4c = 1;
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                  pRVar2[RVar6] = 1;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,6,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,7,cell);
                RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,8,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar5] + pRVar2[RVar4] + pRVar2[RVar6] == 2) {
                  pRVar9 = pRVar2 + RVar6;
                  local_4c = 1;
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
LAB_001cc84c:
                  *pRVar9 = 1;
                }
              }
              else if (iVar1 == 5) {
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,7,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar4] != pRVar2[RVar5]) {
                  local_4c = 1;
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,2,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,4,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar4] != pRVar2[RVar5]) {
                  pRVar9 = pRVar2 + RVar5;
                  local_4c = 1;
                  pRVar2[RVar4] = 1;
                  goto LAB_001cc84c;
                }
              }
              else {
                if (iVar1 != 4) {
                  pcVar15 = "implement cell type";
                  uVar3 = 6;
                  uVar12 = 0x199;
                  uVar14 = 6;
                  goto LAB_001cc938;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,4,cell);
                RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,5,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar5] + pRVar2[RVar4] + pRVar2[RVar6] == 2) {
                  local_4c = 1;
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                  pRVar2[RVar6] = 1;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,2,cell);
                RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,5,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar5] + pRVar2[RVar4] + pRVar2[RVar6] == 2) {
                  local_4c = 1;
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                  pRVar2[RVar6] = 1;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,2,cell);
                RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,4,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar5] + pRVar2[RVar4] + pRVar2[RVar6] == 2) {
                  local_4c = 1;
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                  pRVar2[RVar6] = 1;
                }
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
                RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
                pRVar2 = ref_subdiv->mark;
                if (pRVar2[RVar5] + pRVar2[RVar4] + pRVar2[RVar6] == 2) {
                  local_4c = 1;
                  pRVar2[RVar4] = 1;
                  pRVar2[RVar5] = 1;
                  pRVar2[RVar6] = 1;
                }
                local_40 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
                local_44 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
                RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,2,cell);
                RVar5 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
                RVar6 = ref_subdiv_c2e(ref_subdiv,ref_cell,4,cell);
                RVar7 = ref_subdiv_c2e(ref_subdiv,ref_cell,5,cell);
                pRVar2 = ref_subdiv->mark;
                if ((pRVar2[local_44] + pRVar2[local_40] + pRVar2[RVar4] + pRVar2[RVar5] +
                     pRVar2[RVar6] + pRVar2[RVar7] == 2) &&
                   (((0 < local_40 && 0 < RVar7 || (0 < local_44 && 0 < RVar6)) ||
                    (3 < local_44 && 0 < RVar4)))) {
                  local_4c = 1;
                  RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,0,cell);
                  pRVar2[RVar4] = 1;
                  pRVar2 = ref_subdiv->mark;
                  RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,1,cell);
                  pRVar2[RVar4] = 1;
                  pRVar2 = ref_subdiv->mark;
                  RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,2,cell);
                  pRVar2[RVar4] = 1;
                  pRVar2 = ref_subdiv->mark;
                  RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,3,cell);
                  pRVar2[RVar4] = 1;
                  pRVar2 = ref_subdiv->mark;
                  RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,4,cell);
                  pRVar2[RVar4] = 1;
                  pRVar9 = ref_subdiv->mark;
                  RVar4 = ref_subdiv_c2e(ref_subdiv,ref_cell,5,cell);
                  pRVar9 = pRVar9 + RVar4;
                  goto LAB_001cc84c;
                }
              }
            }
            cell = cell + 1;
          } while (cell < ref_cell->max);
          pRVar10 = ref_subdiv->grid;
          lVar13 = local_38;
        }
        ppRVar11 = pRVar10->cell + lVar13 + 1;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x10);
      uVar3 = ref_edge_ghost_int(ref_subdiv->edge,pRVar10->mpi,ref_subdiv->mark);
      if (uVar3 != 0) {
        pcVar15 = "ghost mark";
        uVar12 = 0x1a1;
        goto LAB_001cc25b;
      }
      uVar3 = ref_mpi_all_or(ref_subdiv->grid->mpi,&local_4c);
      if (uVar3 != 0) {
        pcVar15 = "mpi all or";
        uVar12 = 0x1a3;
        goto LAB_001cc25b;
      }
    } while (local_4c != 0);
    uVar3 = 0;
    if (ref_subdiv->instrument != 0) {
      uVar8 = ref_subdiv_mark_n(ref_subdiv,(REF_INT *)&local_3c);
      if (uVar8 == 0) {
        if (ref_subdiv->grid->mpi->id == 0) {
          uVar3 = 0;
          printf(" %d edges marked after %d relaxations\n",(ulong)local_3c,(ulong)local_48);
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x1a7,"ref_subdiv_mark_relax",(ulong)uVar8,"count");
        uVar3 = uVar8;
      }
    }
  }
  else {
    pcVar15 = "ghost mark";
    uVar12 = 0x17b;
LAB_001cc25b:
    uVar14 = (ulong)uVar3;
LAB_001cc938:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",uVar12
           ,"ref_subdiv_mark_relax",uVar14,pcVar15);
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_relax(REF_SUBDIV ref_subdiv) {
  REF_INT group, cell, nsweeps, nmark;
  REF_CELL ref_cell;
  REF_BOOL again;

  RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                         ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
      "ghost mark");

  nsweeps = 0;
  again = REF_TRUE;
  while (again) {
    nsweeps++;
    again = REF_FALSE;

    each_ref_grid_3d_ref_cell(ref_subdiv_grid(ref_subdiv), group, ref_cell) {
      each_ref_cell_valid_cell(ref_cell, cell) {
        switch (ref_cell_node_per(ref_cell)) {
          case 4:
            promote_2_3(3, 4, 5);
            promote_2_3(1, 2, 5);
            promote_2_3(0, 2, 4);
            promote_2_3(0, 1, 3);
            promote_2_all();
            break;
          case 5:
            edge_or(0, 7); /* opposite quad edges */
            edge_or(2, 4); /* opposite quad edges */
            break;
          case 6:
            edge_or(0, 6);
            edge_or(3, 8);
            edge_or(1, 7);
            promote_2_3(0, 1, 3);
            promote_2_3(6, 7, 8);
            break;
          default:
            RSS(REF_IMPLEMENT, "implement cell type");
            break;
        }
      }
    }

    RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                           ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
        "ghost mark");

    RSS(ref_mpi_all_or(ref_subdiv_mpi(ref_subdiv), &again), "mpi all or");
  }

  if (ref_subdiv->instrument) {
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked after %d relaxations\n", nmark, nsweeps);
  }

  return REF_SUCCESS;
}